

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManWindow(Sbd_Man_t *p,int Pivot)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int Entry;
  abctime aVar4;
  Vec_Int_t *pVVar5;
  abctime aVar6;
  Gia_Obj_t *pGVar7;
  word *pwVar8;
  word *pwVar9;
  word *pIn2;
  int local_2c;
  int Node;
  int i;
  abctime clk;
  int Pivot_local;
  Sbd_Man_t *p_local;
  
  aVar4 = Abc_Clock();
  p->Pivot = Pivot;
  pVVar5 = Vec_WecEntry(p->vTfos,Pivot);
  p->vTfo = pVVar5;
  Vec_IntClear(p->vWinObjs);
  pVVar5 = p->vObj2Var;
  iVar2 = Vec_IntSize(p->vWinObjs);
  Vec_IntWriteEntry(pVVar5,0,iVar2);
  Vec_IntPush(p->vWinObjs,0);
  Gia_ManIncrementTravId(p->pGia);
  Gia_ObjSetTravIdCurrentId(p->pGia,0);
  Sbd_ManWindowSim_rec(p,Pivot);
  if ((p->pPars->nWinSizeMax == 0) ||
     (iVar2 = Vec_IntSize(p->vWinObjs), iVar2 <= p->pPars->nWinSizeMax)) {
    Sbd_ManUpdateOrder(p,Pivot);
    iVar2 = Vec_IntSize(p->vDivVars);
    iVar3 = Vec_IntSize(p->vDivValues);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntSize(p->vDivVars) == Vec_IntSize(p->vDivValues)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x1d1,"int Sbd_ManWindow(Sbd_Man_t *, int)");
    }
    iVar2 = Vec_IntSize(p->vDivVars);
    iVar3 = Vec_IntSize(p->vWinObjs);
    if (iVar3 <= iVar2) {
      __assert_fail("Vec_IntSize(p->vDivVars) < Vec_IntSize(p->vWinObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x1d2,"int Sbd_ManWindow(Sbd_Man_t *, int)");
    }
    pGVar7 = Gia_ManObj(p->pGia,Pivot);
    *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff | 0x40000000;
    pwVar8 = Sbd_ObjSim1(p,Pivot);
    pwVar9 = Sbd_ObjSim0(p,Pivot);
    Abc_TtCopy(pwVar8,pwVar9,p->pPars->nWords,1);
    Vec_IntClear(p->vRoots);
    for (local_2c = 0; iVar2 = Vec_IntSize(p->vTfo), local_2c < iVar2; local_2c = local_2c + 1) {
      iVar2 = Vec_IntEntry(p->vTfo,local_2c);
      pGVar1 = p->pGia;
      iVar3 = Abc_Lit2Var(iVar2);
      pGVar7 = Gia_ManObj(pGVar1,iVar3);
      *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff | 0x40000000;
      iVar3 = Abc_LitIsCompl(iVar2);
      if (iVar3 != 0) {
        iVar3 = Abc_Lit2Var(iVar2);
        Sbd_ManWindowSim_rec(p,iVar3);
        pVVar5 = p->vRoots;
        iVar2 = Abc_Lit2Var(iVar2);
        Vec_IntPush(pVVar5,iVar2);
      }
    }
    pGVar7 = Gia_ManObj(p->pGia,Pivot);
    *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
    for (local_2c = 0; iVar2 = Vec_IntSize(p->vTfo), local_2c < iVar2; local_2c = local_2c + 1) {
      iVar2 = Vec_IntEntry(p->vTfo,local_2c);
      pGVar1 = p->pGia;
      iVar3 = Abc_Lit2Var(iVar2);
      pGVar7 = Gia_ManObj(pGVar1,iVar3);
      *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
      pVVar5 = p->vObj2Var;
      iVar3 = Abc_Lit2Var(iVar2);
      Entry = Vec_IntSize(p->vWinObjs);
      Vec_IntWriteEntry(pVVar5,iVar3,Entry);
      pVVar5 = p->vWinObjs;
      iVar2 = Abc_Lit2Var(iVar2);
      Vec_IntPush(pVVar5,iVar2);
    }
    if ((p->pPars->nWinSizeMax == 0) ||
       (iVar2 = Vec_IntSize(p->vWinObjs), iVar2 <= p->pPars->nWinSizeMax)) {
      iVar2 = Vec_IntSize(p->vTfo);
      if (iVar2 == 0) {
        pwVar8 = Sbd_ObjSim2(p,Pivot);
        Abc_TtFill(pwVar8,p->pPars->nWords);
      }
      else {
        pwVar8 = Sbd_ObjSim2(p,Pivot);
        Abc_TtClear(pwVar8,p->pPars->nWords);
      }
      for (local_2c = 0; iVar2 = Vec_IntSize(p->vTfo), local_2c < iVar2; local_2c = local_2c + 1) {
        iVar2 = Vec_IntEntry(p->vTfo,local_2c);
        iVar3 = Abc_LitIsCompl(iVar2);
        if (iVar3 != 0) {
          pwVar8 = Sbd_ObjSim2(p,Pivot);
          iVar3 = Abc_Lit2Var(iVar2);
          pwVar9 = Sbd_ObjSim0(p,iVar3);
          iVar2 = Abc_Lit2Var(iVar2);
          pIn2 = Sbd_ObjSim1(p,iVar2);
          Abc_TtOrXor(pwVar8,pwVar9,pIn2,p->pPars->nWords);
        }
      }
      aVar6 = Abc_Clock();
      p->timeWin = (aVar6 - aVar4) + p->timeWin;
      Sbd_ManPropagateControl(p,Pivot);
      iVar2 = Vec_IntSize(p->vDivValues);
      if (0x40 < iVar2) {
        __assert_fail("Vec_IntSize(p->vDivValues) <= 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                      ,0x1f8,"int Sbd_ManWindow(Sbd_Man_t *, int)");
      }
      iVar2 = Vec_IntSize(p->vDivValues);
      p_local._4_4_ = (uint)(iVar2 < 0x41);
    }
    else {
      aVar6 = Abc_Clock();
      p->timeWin = (aVar6 - aVar4) + p->timeWin;
      p_local._4_4_ = 0;
    }
  }
  else {
    aVar6 = Abc_Clock();
    p->timeWin = (aVar6 - aVar4) + p->timeWin;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Sbd_ManWindow( Sbd_Man_t * p, int Pivot )
{
    abctime clk = Abc_Clock();
    int i, Node;
    // assign pivot and TFO (assume siminfo is assigned at the PIs)
    p->Pivot = Pivot;
    p->vTfo = Vec_WecEntry( p->vTfos, Pivot );
    // add constant node
    Vec_IntClear( p->vWinObjs );
    Vec_IntWriteEntry( p->vObj2Var, 0, Vec_IntSize(p->vWinObjs) );
    Vec_IntPush( p->vWinObjs, 0 );
    // simulate TFI cone
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrentId(p->pGia, 0);
    Sbd_ManWindowSim_rec( p, Pivot );
    if ( p->pPars->nWinSizeMax && Vec_IntSize(p->vWinObjs) > p->pPars->nWinSizeMax )
    {
        p->timeWin += Abc_Clock() - clk;
        return 0;
    }
    Sbd_ManUpdateOrder( p, Pivot );
    assert( Vec_IntSize(p->vDivVars) == Vec_IntSize(p->vDivValues) );
    assert( Vec_IntSize(p->vDivVars) < Vec_IntSize(p->vWinObjs) );
    // simulate node
    Gia_ManObj(p->pGia, Pivot)->fMark0 = 1;
    Abc_TtCopy( Sbd_ObjSim1(p, Pivot), Sbd_ObjSim0(p, Pivot), p->pPars->nWords, 1 );
    // mark TFO and simulate extended TFI without adding TFO nodes
    Vec_IntClear( p->vRoots );
    Vec_IntForEachEntry( p->vTfo, Node, i )
    {
        Gia_ManObj(p->pGia, Abc_Lit2Var(Node))->fMark0 = 1;
        if ( !Abc_LitIsCompl(Node) ) 
            continue;
        Sbd_ManWindowSim_rec( p, Abc_Lit2Var(Node) );
        Vec_IntPush( p->vRoots, Abc_Lit2Var(Node) );
    }
    // add TFO nodes and remove marks
    Gia_ManObj(p->pGia, Pivot)->fMark0 = 0;
    Vec_IntForEachEntry( p->vTfo, Node, i )
    {
        Gia_ManObj(p->pGia, Abc_Lit2Var(Node))->fMark0 = 0;
        Vec_IntWriteEntry( p->vObj2Var, Abc_Lit2Var(Node), Vec_IntSize(p->vWinObjs) );
        Vec_IntPush( p->vWinObjs, Abc_Lit2Var(Node) );
    }
    if ( p->pPars->nWinSizeMax && Vec_IntSize(p->vWinObjs) > p->pPars->nWinSizeMax )
    {
        p->timeWin += Abc_Clock() - clk;
        return 0;
    }
    // compute controlability for node
    if ( Vec_IntSize(p->vTfo) == 0 )
        Abc_TtFill( Sbd_ObjSim2(p, Pivot), p->pPars->nWords );
    else
        Abc_TtClear( Sbd_ObjSim2(p, Pivot), p->pPars->nWords );
    Vec_IntForEachEntry( p->vTfo, Node, i )
        if ( Abc_LitIsCompl(Node) ) // root
            Abc_TtOrXor( Sbd_ObjSim2(p, Pivot), Sbd_ObjSim0(p, Abc_Lit2Var(Node)), Sbd_ObjSim1(p, Abc_Lit2Var(Node)), p->pPars->nWords );
    p->timeWin += Abc_Clock() - clk;
    // propagate controlability to fanins for the TFI nodes starting from the pivot
    Sbd_ManPropagateControl( p, Pivot );
    assert( Vec_IntSize(p->vDivValues) <= 64 );
    return (int)(Vec_IntSize(p->vDivValues) <= 64);
}